

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::Postprocess_BuildConstellation
          (AMFImporter *this,CAMFImporter_NodeElement_Constellation *pConstellation,
          list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList)

{
  size_t *psVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong __n;
  long *******ppppppplVar14;
  bool bVar15;
  aiNode *this_00;
  aiNode *this_01;
  aiNode **ppaVar16;
  _List_node_base *p_Var17;
  long lVar18;
  _List_node_base *p_Var19;
  runtime_error *prVar20;
  iterator __begin1;
  long *******ppppppplVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined4 extraout_XMM0_Db;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  list<aiNode_*,_std::allocator<aiNode_*>_> ch_node;
  aiNode *found_node;
  float fStack_174;
  long *******local_120;
  long *******local_118;
  ulong local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  aiNode *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_110 = 0;
  local_120 = (long *******)&local_120;
  local_118 = (long *******)&local_120;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  __n = (pConstellation->super_CAMFImporter_NodeElement).ID._M_string_length;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    memcpy((this_00->mName).data,
           (pConstellation->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  p_Var19 = (pConstellation->super_CAMFImporter_NodeElement).Child.
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  do {
    ppppppplVar21 = local_120;
    if (p_Var19 == (_List_node_base *)&(pConstellation->super_CAMFImporter_NodeElement).Child) {
      if ((long ********)local_120 == &local_120) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e0,"<constellation> must have at least one <instance>.","");
        std::runtime_error::runtime_error(prVar20,(string *)local_e0);
        *(undefined ***)prVar20 = &PTR__runtime_error_008dc448;
        __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00->mNumChildren = (uint)local_110;
      ppaVar16 = (aiNode **)operator_new__((local_110 & 0xffffffff) << 3);
      this_00->mChildren = ppaVar16;
      lVar18 = 0;
      do {
        *(long *******)((long)this_00->mChildren + lVar18) = ppppppplVar21[2];
        ppppppplVar21 = (long *******)*ppppppplVar21;
        lVar18 = lVar18 + 8;
      } while ((long ********)ppppppplVar21 != &local_120);
      p_Var19 = (_List_node_base *)operator_new(0x18);
      p_Var19[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var19);
      psVar1 = &(pNodeList->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      ppppppplVar21 = local_120;
      while ((long ********)ppppppplVar21 != &local_120) {
        ppppppplVar14 = (long *******)*ppppppplVar21;
        operator_delete(ppppppplVar21);
        ppppppplVar21 = ppppppplVar14;
      }
      return;
    }
    p_Var17 = p_Var19[1]._M_next;
    if (*(int *)&p_Var17->_M_prev == 4) {
      bVar15 = Find_ConvertedNode(this,(string *)(p_Var17 + 5),pNodeList,&local_c0);
      if (!bVar15) {
        Throw_ID_NotFound(this,(string *)(p_Var17 + 5));
      }
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      this_01->mParent = this_00;
      fVar27 = *(float *)&p_Var17[7]._M_next;
      fVar23 = *(float *)((long)(p_Var17 + 7) + 4);
      fVar2 = *(float *)((long)(p_Var17 + 7) + 8);
      fVar29 = (this_01->mTransformation).a1;
      fVar3 = (this_01->mTransformation).a2;
      fVar4 = (this_01->mTransformation).a3;
      fVar5 = (this_01->mTransformation).b1;
      fVar6 = (this_01->mTransformation).b2;
      fVar7 = (this_01->mTransformation).b3;
      fVar8 = (this_01->mTransformation).c1;
      fVar33 = (this_01->mTransformation).c2;
      fVar9 = (this_01->mTransformation).c3;
      fVar10 = (this_01->mTransformation).d1;
      fVar11 = (this_01->mTransformation).d2;
      fVar12 = (this_01->mTransformation).d3;
      fVar13 = (this_01->mTransformation).a4;
      fVar22 = fVar13 * 0.0;
      fVar24 = (this_01->mTransformation).b4;
      fVar25 = (this_01->mTransformation).c4;
      fVar26 = (this_01->mTransformation).d4;
      (this_01->mTransformation).a1 = fVar22 + fVar4 * 0.0 + fVar29 + fVar3 * 0.0;
      (this_01->mTransformation).a2 = fVar22 + fVar4 * 0.0 + fVar29 * 0.0 + fVar3;
      (this_01->mTransformation).a3 = fVar29 * 0.0 + fVar3 * 0.0 + fVar4 + fVar22;
      (this_01->mTransformation).a4 = fVar2 * fVar4 + fVar3 * fVar23 + fVar27 * fVar29 + fVar13;
      fVar29 = fVar24 * 0.0;
      (this_01->mTransformation).b1 = fVar29 + fVar7 * 0.0 + fVar5 + fVar6 * 0.0;
      (this_01->mTransformation).b2 = fVar29 + fVar7 * 0.0 + fVar5 * 0.0 + fVar6;
      (this_01->mTransformation).b3 = fVar5 * 0.0 + fVar6 * 0.0 + fVar7 + fVar29;
      (this_01->mTransformation).b4 = fVar2 * fVar7 + fVar6 * fVar23 + fVar27 * fVar5 + fVar24;
      fVar29 = fVar25 * 0.0;
      (this_01->mTransformation).c1 = fVar29 + fVar9 * 0.0 + fVar8 + fVar33 * 0.0;
      (this_01->mTransformation).c2 = fVar29 + fVar9 * 0.0 + fVar8 * 0.0 + fVar33;
      (this_01->mTransformation).c3 = fVar8 * 0.0 + fVar33 * 0.0 + fVar9 + fVar29;
      (this_01->mTransformation).c4 = fVar2 * fVar9 + fVar33 * fVar23 + fVar27 * fVar8 + fVar25;
      fVar29 = fVar26 * 0.0;
      (this_01->mTransformation).d1 = fVar29 + fVar12 * 0.0 + fVar10 + fVar11 * 0.0;
      (this_01->mTransformation).d2 = fVar29 + fVar12 * 0.0 + fVar10 * 0.0 + fVar11;
      (this_01->mTransformation).d3 = fVar10 * 0.0 + fVar11 * 0.0 + fVar12 + fVar29;
      (this_01->mTransformation).d4 = fVar2 * fVar12 + fVar23 * fVar11 + fVar27 * fVar10 + fVar26;
      fVar27 = *(float *)((long)(p_Var17 + 7) + 0xc);
      fVar23 = cosf(fVar27);
      local_108._0_4_ = fVar23;
      fVar24 = sinf(fVar27);
      fVar27 = (this_01->mTransformation).a1;
      fVar23 = (this_01->mTransformation).a2;
      fVar2 = (this_01->mTransformation).a3;
      fVar22 = fVar27 * 0.0;
      fVar29 = (this_01->mTransformation).b1;
      fVar3 = (this_01->mTransformation).b2;
      fVar4 = (this_01->mTransformation).b3;
      fVar31 = fVar29 * 0.0;
      fVar5 = (this_01->mTransformation).c1;
      fVar6 = (this_01->mTransformation).c2;
      fVar7 = (this_01->mTransformation).c3;
      fVar32 = fVar5 * 0.0;
      fVar8 = (this_01->mTransformation).d2;
      fVar33 = (this_01->mTransformation).d1;
      fVar25 = fVar33 + fVar8 * 0.0;
      fVar33 = fVar33 * 0.0;
      fVar26 = (float)local_108._0_4_ * fVar8 + fVar33;
      local_f8 = CONCAT44(fVar26,fVar25);
      uStack_f0 = 0;
      fVar9 = (this_01->mTransformation).d3;
      fVar10 = (this_01->mTransformation).a4;
      fVar34 = fVar10 * 0.0;
      fVar11 = (this_01->mTransformation).b4;
      fVar12 = (this_01->mTransformation).c4;
      fVar13 = (this_01->mTransformation).d4;
      (this_01->mTransformation).a1 = fVar34 + fVar2 * 0.0 + fVar27 + fVar23 * 0.0;
      (this_01->mTransformation).a2 =
           fVar34 + fVar2 * fVar24 + (float)local_108._0_4_ * fVar23 + fVar22;
      (this_01->mTransformation).a3 =
           (float)local_108._0_4_ * fVar2 + (fVar22 - fVar23 * fVar24) + fVar34;
      (this_01->mTransformation).a4 = fVar2 * 0.0 + fVar22 + fVar23 * 0.0 + fVar10;
      fVar27 = fVar11 * 0.0;
      (this_01->mTransformation).b1 = fVar27 + fVar4 * 0.0 + fVar29 + fVar3 * 0.0;
      (this_01->mTransformation).b2 =
           fVar27 + fVar4 * fVar24 + (float)local_108._0_4_ * fVar3 + fVar31;
      (this_01->mTransformation).b3 =
           (float)local_108._0_4_ * fVar4 + (fVar31 - fVar3 * fVar24) + fVar27;
      (this_01->mTransformation).b4 = fVar4 * 0.0 + fVar31 + fVar3 * 0.0 + fVar11;
      fVar27 = fVar12 * 0.0;
      (this_01->mTransformation).c1 = fVar27 + fVar7 * 0.0 + fVar5 + fVar6 * 0.0;
      (this_01->mTransformation).c2 =
           fVar27 + fVar7 * fVar24 + (float)local_108._0_4_ * fVar6 + fVar32;
      (this_01->mTransformation).c3 =
           (float)local_108._0_4_ * fVar7 + (fVar32 - fVar6 * fVar24) + fVar27;
      (this_01->mTransformation).c4 = fVar7 * 0.0 + fVar32 + fVar6 * 0.0 + fVar12;
      fVar27 = fVar13 * 0.0;
      (this_01->mTransformation).d1 = fVar27 + fVar9 * 0.0 + fVar25;
      (this_01->mTransformation).d2 = fVar27 + fVar9 * fVar24 + fVar26;
      (this_01->mTransformation).d3 =
           (float)local_108._0_4_ * fVar9 + (fVar33 - fVar8 * fVar24) + fVar27;
      (this_01->mTransformation).d4 = fVar9 * 0.0 + fVar33 + fVar8 * 0.0 + fVar13;
      fVar27 = *(float *)&p_Var17[8]._M_next;
      fVar24 = cosf(fVar27);
      fVar25 = sinf(fVar27);
      fVar27 = (this_01->mTransformation).a1;
      fVar23 = (this_01->mTransformation).a2;
      local_48 = ZEXT416((uint)fVar23);
      fVar30 = fVar23 * 0.0;
      fVar2 = (this_01->mTransformation).a3;
      local_a8 = ZEXT416((uint)fVar30);
      fVar26 = fVar2 * 0.0 + fVar27 * 0.0 + fVar30;
      local_78 = ZEXT416((uint)fVar26);
      fVar29 = (this_01->mTransformation).b1;
      fVar3 = (this_01->mTransformation).b2;
      fVar22 = fVar3 * 0.0;
      fVar4 = (this_01->mTransformation).b3;
      local_88 = ZEXT416((uint)fVar22);
      fVar31 = fVar4 * 0.0 + fVar29 * 0.0 + fVar22;
      local_68 = ZEXT416((uint)fVar31);
      fVar5 = (this_01->mTransformation).c2;
      local_108 = ZEXT416((uint)fVar5);
      fVar32 = fVar5 * 0.0;
      fVar6 = (this_01->mTransformation).c1;
      local_98 = ZEXT416((uint)fVar32);
      fVar7 = (this_01->mTransformation).c3;
      fVar34 = fVar24 * fVar7 + fVar25 * fVar6 + fVar32;
      local_f8 = CONCAT44(extraout_XMM0_Db,fVar34);
      fVar8 = (this_01->mTransformation).d2;
      local_58 = ZEXT416((uint)fVar8);
      fVar36 = fVar8 * 0.0;
      fVar33 = (this_01->mTransformation).d1;
      local_b8 = ZEXT416((uint)fVar24);
      fVar9 = (this_01->mTransformation).d3;
      fVar28 = -fVar25;
      fVar10 = (this_01->mTransformation).a4;
      fVar35 = fVar10 * 0.0;
      fVar11 = (this_01->mTransformation).b4;
      fVar12 = (this_01->mTransformation).c4;
      fVar13 = (this_01->mTransformation).d4;
      (this_01->mTransformation).a1 = fVar35 + fVar2 * fVar28 + fVar27 * fVar24 + fVar30;
      (this_01->mTransformation).a2 = fVar35 + fVar2 * 0.0 + fVar27 * 0.0 + fVar23;
      (this_01->mTransformation).a3 = fVar24 * fVar2 + fVar25 * fVar27 + fVar30 + fVar35;
      (this_01->mTransformation).a4 = fVar26 + fVar10;
      fVar27 = fVar11 * 0.0;
      (this_01->mTransformation).b1 = fVar27 + fVar4 * fVar28 + fVar29 * fVar24 + fVar22;
      (this_01->mTransformation).b2 = fVar27 + fVar4 * 0.0 + fVar29 * 0.0 + fVar3;
      (this_01->mTransformation).b3 = fVar24 * fVar4 + fVar25 * fVar29 + fVar22 + fVar27;
      (this_01->mTransformation).b4 = fVar31 + fVar11;
      fVar27 = fVar12 * 0.0;
      (this_01->mTransformation).c1 = fVar27 + fVar7 * fVar28 + fVar6 * fVar24 + fVar32;
      (this_01->mTransformation).c2 = fVar27 + fVar7 * 0.0 + fVar6 * 0.0 + fVar5;
      (this_01->mTransformation).c3 = fVar34 + fVar27;
      (this_01->mTransformation).c4 = fVar7 * 0.0 + fVar6 * 0.0 + fVar32 + fVar12;
      fVar27 = fVar13 * 0.0;
      (this_01->mTransformation).d1 = fVar27 + fVar9 * fVar28 + fVar33 * fVar24 + fVar36;
      (this_01->mTransformation).d2 = fVar27 + fVar9 * 0.0 + fVar33 * 0.0 + fVar8;
      (this_01->mTransformation).d3 = fVar24 * fVar9 + fVar25 * fVar33 + fVar36 + fVar27;
      (this_01->mTransformation).d4 = fVar9 * 0.0 + fVar33 * 0.0 + fVar36 + fVar13;
      fVar27 = *(float *)((long)(p_Var17 + 8) + 4);
      fVar24 = cosf(fVar27);
      fVar25 = sinf(fVar27);
      fVar27 = (this_01->mTransformation).a1;
      fVar23 = (this_01->mTransformation).a2;
      fVar32 = fVar27 * 0.0 + fVar23 * 0.0;
      fVar2 = (this_01->mTransformation).b1;
      fVar29 = (this_01->mTransformation).b2;
      fVar31 = fVar2 * 0.0 + fVar29 * 0.0;
      fVar3 = (this_01->mTransformation).c1;
      fVar4 = (this_01->mTransformation).c2;
      fVar22 = fVar3 * 0.0 + fVar4 * 0.0;
      fVar5 = (this_01->mTransformation).d1;
      fVar6 = (this_01->mTransformation).d2;
      fVar26 = fVar5 * 0.0 + fVar6 * 0.0;
      fVar7 = (this_01->mTransformation).a3;
      fStack_174 = -fVar25;
      fVar8 = (this_01->mTransformation).a4;
      fVar28 = fVar7 * 0.0;
      fVar34 = fVar8 * 0.0;
      fVar33 = (this_01->mTransformation).b3;
      fVar9 = (this_01->mTransformation).b4;
      fVar10 = (this_01->mTransformation).c3;
      fVar11 = (this_01->mTransformation).c4;
      fVar12 = (this_01->mTransformation).d3;
      fVar13 = (this_01->mTransformation).d4;
      (this_01->mTransformation).a1 = fVar34 + fVar28 + fVar27 * fVar24 + fVar23 * fVar25;
      (this_01->mTransformation).a2 = fVar34 + fVar28 + fVar27 * -fVar25 + fVar23 * fVar24;
      (this_01->mTransformation).a3 = fVar7 + fVar32 + fVar34;
      (this_01->mTransformation).a4 = fVar32 + fVar28 + fVar8;
      fVar23 = fVar33 * 0.0;
      fVar27 = fVar9 * 0.0;
      (this_01->mTransformation).b1 = fVar27 + fVar23 + fVar2 * fVar24 + fVar29 * fVar25;
      (this_01->mTransformation).b2 = fVar27 + fVar23 + fVar2 * fStack_174 + fVar29 * fVar24;
      (this_01->mTransformation).b3 = fVar33 + fVar31 + fVar27;
      (this_01->mTransformation).b4 = fVar31 + fVar23 + fVar9;
      fVar27 = fVar10 * 0.0;
      fVar23 = fVar11 * 0.0;
      (this_01->mTransformation).c1 = fVar23 + fVar27 + fVar3 * fVar24 + fVar4 * fVar25;
      (this_01->mTransformation).c2 = fVar23 + fVar27 + fVar3 * fStack_174 + fVar4 * fVar24;
      (this_01->mTransformation).c3 = fVar10 + fVar22 + fVar23;
      (this_01->mTransformation).c4 = fVar22 + fVar27 + fVar11;
      fVar27 = fVar12 * 0.0;
      fVar23 = fVar13 * 0.0;
      (this_01->mTransformation).d1 = fVar23 + fVar27 + fVar5 * fVar24 + fVar6 * fVar25;
      (this_01->mTransformation).d2 = fVar23 + fVar27 + fVar5 * fStack_174 + fVar6 * fVar24;
      (this_01->mTransformation).d3 = fVar12 + fVar26 + fVar23;
      (this_01->mTransformation).d4 = fVar26 + fVar27 + fVar13;
      this_01->mNumChildren = 1;
      ppaVar16 = (aiNode **)operator_new__(8);
      this_01->mChildren = ppaVar16;
      SceneCombiner::Copy(ppaVar16,local_c0);
      (*this_01->mChildren)->mParent = this_01;
      p_Var17 = (_List_node_base *)operator_new(0x18);
      p_Var17[1]._M_next = (_List_node_base *)this_01;
      std::__detail::_List_node_base::_M_hook(p_Var17);
      local_110 = local_110 + 1;
    }
    else if (*(int *)&p_Var17->_M_prev != 6) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"Only <instance> nodes can be in <constellation>.","");
      std::runtime_error::runtime_error(prVar20,(string *)local_e0);
      *(undefined ***)prVar20 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var19 = p_Var19->_M_next;
  } while( true );
}

Assistant:

void AMFImporter::Postprocess_BuildConstellation(CAMFImporter_NodeElement_Constellation& pConstellation, std::list<aiNode*>& pNodeList) const
{
aiNode* con_node;
std::list<aiNode*> ch_node;

	// We will build next hierarchy:
	// aiNode as parent (<constellation>) for set of nodes as a children
	//  |- aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	//  ...
	//  \_ aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	con_node = new aiNode;
	con_node->mName = pConstellation.ID;
	// Walk through children and search for instances of another objects, constellations.
	for(const CAMFImporter_NodeElement* ne: pConstellation.Child)
	{
		aiMatrix4x4 tmat;
		aiNode* t_node;
		aiNode* found_node;

		if(ne->Type == CAMFImporter_NodeElement::ENET_Metadata) continue;
		if(ne->Type != CAMFImporter_NodeElement::ENET_Instance) throw DeadlyImportError("Only <instance> nodes can be in <constellation>.");

		// create alias for conveniance
		CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);
		// find referenced object
		if(!Find_ConvertedNode(als.ObjectID, pNodeList, &found_node)) Throw_ID_NotFound(als.ObjectID);

		// create node for applying transformation
		t_node = new aiNode;
		t_node->mParent = con_node;
		// apply transformation
		aiMatrix4x4::Translation(als.Delta, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationX(als.Rotation.x, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationY(als.Rotation.y, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationZ(als.Rotation.z, tmat), t_node->mTransformation *= tmat;
		// create array for one child node
		t_node->mNumChildren = 1;
		t_node->mChildren = new aiNode*[t_node->mNumChildren];
		SceneCombiner::Copy(&t_node->mChildren[0], found_node);
		t_node->mChildren[0]->mParent = t_node;
		ch_node.push_back(t_node);
	}// for(const CAMFImporter_NodeElement* ne: pConstellation.Child)

	// copy found aiNode's as children
	if(ch_node.empty()) throw DeadlyImportError("<constellation> must have at least one <instance>.");

	size_t ch_idx = 0;

	con_node->mNumChildren = static_cast<unsigned int>(ch_node.size());
	con_node->mChildren = new aiNode*[con_node->mNumChildren];
	for(aiNode* node: ch_node) con_node->mChildren[ch_idx++] = node;

	// and place "root" of <constellation> node to node list
	pNodeList.push_back(con_node);
}